

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectRestraint.hpp
# Opt level: O2

void __thiscall OpenMD::ObjectRestraint::ObjectRestraint(ObjectRestraint *this)

{
  Restraint::Restraint(&this->super_Restraint);
  (this->super_Restraint)._vptr_Restraint = (_func_int **)&PTR__ObjectRestraint_002c70e8;
  Vector<double,_3U>::Vector(&(this->refPos_).super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->refA_).super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&(this->force_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->torque_).super_Vector<double,_3U>);
  return;
}

Assistant:

ObjectRestraint() : Restraint() {}